

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O0

void __thiscall AviWriter::~AviWriter(AviWriter *this)

{
  size_type sVar1;
  reference ppAVar2;
  value_type record;
  AviWriter *this_local;
  
  if (this->fOutFid != (FILE *)0x0) {
    fclose((FILE *)this->fOutFid);
  }
  sVar1 = std::
          queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_>
          ::size(&this->indexRecords);
  if (sVar1 != 0) {
    ppAVar2 = std::
              queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_>
              ::front(&this->indexRecords);
    if (*ppAVar2 != (value_type)0x0) {
      operator_delete(*ppAVar2,0x10);
    }
    std::queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_>::
    pop(&this->indexRecords);
  }
  std::queue<AVIIndexRecord_*,_std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>_>::
  ~queue(&this->indexRecords);
  return;
}

Assistant:

AviWriter::~AviWriter()
{
    if (fOutFid != NULL)
        fclose(fOutFid);

    if (indexRecords.size())
    {
        auto record = indexRecords.front();
        delete record;
        indexRecords.pop();
    }
}